

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SimpleParallelSimulationDataGenerator::Initialize
          (SimpleParallelSimulationDataGenerator *this,U32 simulation_sample_rate,
          SimpleParallelAnalyzerSettings *settings)

{
  size_type sVar1;
  reference pvVar2;
  SimulationChannelDescriptor *pSVar3;
  value_type_conflict local_32;
  value_type pSStack_30;
  U16 val;
  uint local_28;
  uint local_24;
  U32 i;
  U32 count;
  SimpleParallelAnalyzerSettings *settings_local;
  SimpleParallelSimulationDataGenerator *pSStack_10;
  U32 simulation_sample_rate_local;
  SimpleParallelSimulationDataGenerator *this_local;
  
  this->mSettings = settings;
  this->mSimulationSampleRateHz = simulation_sample_rate;
  _i = settings;
  settings_local._4_4_ = simulation_sample_rate;
  pSStack_10 = this;
  std::vector<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>::clear
            (&this->mData);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->mDataMasks);
  sVar1 = std::vector<Channel,_std::allocator<Channel>_>::size(&this->mSettings->mDataChannels);
  local_24 = (uint)sVar1;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    pvVar2 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&this->mSettings->mDataChannels,(ulong)local_28);
    pSStack_30 = (value_type)
                 SimulationChannelDescriptorGroup::Add
                           ((Channel *)&this->mSimulationData,(uint)pvVar2,
                            this->mSimulationSampleRateHz);
    std::vector<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>::
    push_back(&this->mData,&stack0xffffffffffffffd0);
    local_32 = (value_type_conflict)(1 << ((byte)local_28 & 0x1f));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->mDataMasks,&local_32);
  }
  if (this->mSettings->mClockEdge == NegEdge) {
    pSVar3 = (SimulationChannelDescriptor *)
             SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationData,(int)this->mSettings + 0x28,
                        this->mSimulationSampleRateHz);
    this->mClock = pSVar3;
  }
  else {
    pSVar3 = (SimulationChannelDescriptor *)
             SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationData,(int)this->mSettings + 0x28,
                        this->mSimulationSampleRateHz);
    this->mClock = pSVar3;
  }
  this->mValue = 0;
  return;
}

Assistant:

void SimpleParallelSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SimpleParallelAnalyzerSettings* settings )
{
	mSettings = settings;
	mSimulationSampleRateHz = simulation_sample_rate;

	mData.clear();
	mDataMasks.clear();

	U32 count = (U32)mSettings->mDataChannels.size();
	for( U32 i=0; i<count; i++ )
	{
		mData.push_back( mSimulationData.Add( mSettings->mDataChannels[i], mSimulationSampleRateHz, BIT_LOW ) );
		U16 val = 1 << i;
		mDataMasks.push_back( val );
	}

	if( mSettings->mClockEdge == AnalyzerEnums::NegEdge )
		mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_LOW );
	else
		mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );

	mValue = 0;
}